

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::gjInverse
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this,bool singExc)

{
  ulong uVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  SingMatrixExc *this_00;
  float *pfVar12;
  undefined1 (*pauVar13) [16];
  undefined8 *puVar14;
  long lVar15;
  float *pfVar16;
  ulong uVar17;
  undefined8 *puVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  float *pfVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Matrix44<float> s;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  puVar10 = &local_b8;
  uStack_b0 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  local_88 = 0;
  local_b8 = 0x3f800000;
  local_a8 = 0x3f80000000000000;
  uStack_90 = 0x3f800000;
  uStack_80 = 0x3f80000000000000;
  pfVar16 = (float *)&local_68;
  local_78 = *(undefined8 *)this->x[0];
  uStack_70 = *(undefined8 *)(this->x[0] + 2);
  local_68 = *(undefined8 *)this->x[1];
  uStack_60 = *(undefined8 *)(this->x[1] + 2);
  local_58 = *(undefined8 *)this->x[2];
  uStack_50 = *(undefined8 *)(this->x[2] + 2);
  local_48 = *(undefined8 *)this->x[3];
  uStack_40 = *(undefined8 *)(this->x[3] + 2);
  lVar15 = -3;
  puVar11 = &local_78;
  uVar17 = 0;
  while (uVar17 != 3) {
    lVar22 = uVar17 * 0x10;
    pfVar12 = (float *)(&local_78 + uVar17 * 2);
    uVar1 = uVar17 + 1;
    fVar3 = pfVar12[uVar17];
    fVar27 = -fVar3;
    if (-fVar3 <= fVar3) {
      fVar27 = fVar3;
    }
    uVar20 = uVar17 & 0xffffffff;
    lVar19 = lVar15;
    pfVar23 = pfVar16;
    do {
      fVar3 = *pfVar23;
      fVar25 = -fVar3;
      if (-fVar3 <= fVar3) {
        fVar25 = fVar3;
      }
      if (fVar27 < fVar25) {
        uVar20 = (ulong)((int)lVar19 + 4);
        fVar27 = fVar25;
      }
      pfVar23 = pfVar23 + 4;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0);
    if ((fVar27 != 0.0) || (NAN(fVar27))) {
      if (uVar17 != uVar20) {
        lVar19 = (long)(int)uVar20 * 0x10;
        lVar21 = 0;
        do {
          uVar4 = *(undefined4 *)((long)puVar11 + lVar21 * 4);
          *(undefined4 *)((long)puVar11 + lVar21 * 4) =
               *(undefined4 *)((long)&local_78 + lVar21 * 4 + lVar19);
          *(undefined4 *)((long)&local_78 + lVar21 * 4 + lVar19) = uVar4;
          uVar4 = *(undefined4 *)((long)puVar10 + lVar21 * 4);
          *(undefined4 *)((long)puVar10 + lVar21 * 4) =
               *(undefined4 *)((long)&local_b8 + lVar21 * 4 + lVar19 + -0xb8 + 0xb8);
          *(undefined4 *)((long)&local_b8 + lVar21 * 4 + lVar19 + -0xb8 + 0xb8) = uVar4;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 4);
      }
      lVar19 = 0x10;
      uVar20 = uVar17;
      do {
        fVar26 = -*(float *)((long)pfVar16 + lVar19 + -0x10) / pfVar12[uVar17];
        pfVar23 = (float *)((long)puVar11 + lVar19);
        auVar28._0_4_ = *pfVar12 * fVar26 + *pfVar23;
        auVar28._4_4_ = *(float *)((long)&local_78 + lVar22 + 4) * fVar26 + pfVar23[1];
        auVar28._8_4_ = *(float *)(&uStack_70 + uVar17 * 2) * fVar26 + pfVar23[2];
        auVar28._12_4_ = *(float *)((long)&uStack_70 + lVar22 + 4) * fVar26 + pfVar23[3];
        *(undefined1 (*) [16])((long)puVar11 + lVar19) = auVar28;
        fVar3 = *(float *)((long)&local_b8 + lVar22 + 4);
        fVar25 = *(float *)(&uStack_b0 + uVar17 * 2);
        fVar5 = *(float *)((long)&uStack_b0 + lVar22 + 4);
        pfVar23 = (float *)((long)puVar10 + lVar19);
        fVar7 = pfVar23[1];
        fVar8 = pfVar23[2];
        fVar9 = pfVar23[3];
        pfVar2 = (float *)((long)puVar10 + lVar19);
        *pfVar2 = fVar26 * *(float *)(&local_b8 + uVar17 * 2) + *pfVar23;
        pfVar2[1] = fVar26 * fVar3 + fVar7;
        pfVar2[2] = fVar26 * fVar25 + fVar8;
        pfVar2[3] = fVar26 * fVar5 + fVar9;
        uVar20 = uVar20 + 1;
        lVar19 = lVar19 + 0x10;
      } while (uVar20 < 3);
    }
    else {
      if (singExc) goto LAB_001462a8;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 0xc) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 0xc) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 0xc) = 0.0;
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[2][2] = 1.0;
      __return_storage_ptr__->x[3][3] = 1.0;
    }
    lVar15 = lVar15 + 1;
    pfVar16 = pfVar16 + 5;
    puVar10 = (undefined8 *)((long)puVar10 + 0x10);
    puVar11 = puVar11 + 2;
    uVar17 = uVar1;
    if ((fVar27 == 0.0) && (!NAN(fVar27))) {
      return __return_storage_ptr__;
    }
  }
  puVar11 = &local_88;
  lVar15 = 3;
  puVar10 = &local_48;
  do {
    pauVar13 = (undefined1 (*) [16])(&local_78 + lVar15 * 2);
    fVar3 = *(float *)(*pauVar13 + lVar15 * 4);
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      auVar29._4_4_ = fVar3;
      auVar29._0_4_ = fVar3;
      auVar29._8_4_ = fVar3;
      auVar29._12_4_ = fVar3;
      auVar29 = divps(*pauVar13,auVar29);
      *pauVar13 = auVar29;
      auVar6._4_4_ = fVar3;
      auVar6._0_4_ = fVar3;
      auVar6._8_4_ = fVar3;
      auVar6._12_4_ = fVar3;
      auVar29 = divps(*(undefined1 (*) [16])(&local_b8 + lVar15 * 2),auVar6);
      *(undefined1 (*) [16])(&local_b8 + lVar15 * 2) = auVar29;
      if (lVar15 != 0) {
        lVar22 = 0;
        puVar14 = &local_b8;
        puVar18 = &local_78;
        do {
          fVar27 = -*(float *)((long)&local_78 + lVar15 * 4 + lVar22 * 0x10);
          lVar19 = 0;
          do {
            fVar25 = *(float *)((long)puVar11 + lVar19);
            fVar5 = *(float *)((long)puVar14 + lVar19);
            *(float *)((long)puVar18 + lVar19) =
                 *(float *)((long)puVar10 + lVar19) * fVar27 + *(float *)((long)puVar18 + lVar19);
            *(float *)((long)puVar14 + lVar19) = fVar25 * fVar27 + fVar5;
            lVar19 = lVar19 + 4;
          } while (lVar19 != 0x10);
          lVar22 = lVar22 + 1;
          puVar14 = (undefined8 *)((long)puVar14 + 0x10);
          puVar18 = puVar18 + 2;
        } while (lVar22 != lVar15);
      }
    }
    else {
      if (singExc) {
LAB_001462a8:
        this_00 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
        Imath_2_5::SingMatrixExc::SingMatrixExc(this_00,"Cannot invert singular matrix.");
        __cxa_throw(this_00,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
      }
      *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 0) + 0xc) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 0xc) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 0xc) = 0.0;
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[2][2] = 1.0;
      __return_storage_ptr__->x[3][3] = 1.0;
    }
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      return __return_storage_ptr__;
    }
    puVar11 = puVar11 + -2;
    puVar10 = puVar10 + -2;
    bVar24 = lVar15 == 0;
    lVar15 = lVar15 + -1;
    if (bVar24) {
      *(undefined8 *)__return_storage_ptr__->x[0] = local_b8;
      *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = uStack_b0;
      *(undefined8 *)__return_storage_ptr__->x[1] = local_a8;
      *(undefined8 *)(__return_storage_ptr__->x[1] + 2) = uStack_a0;
      *(undefined8 *)__return_storage_ptr__->x[2] = local_98;
      *(undefined8 *)(__return_storage_ptr__->x[2] + 2) = uStack_90;
      *(undefined8 *)__return_storage_ptr__->x[3] = local_88;
      *(undefined8 *)(__return_storage_ptr__->x[3] + 2) = uStack_80;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

inline
Matrix44<T>::Matrix44 ()
{
    memset (x, 0, sizeof (x));
    x[0][0] = 1;
    x[1][1] = 1;
    x[2][2] = 1;
    x[3][3] = 1;
}